

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

void __thiscall
HighsCliqueTable::cliquePartition
          (HighsCliqueTable *this,vector<double,_std::allocator<double>_> *objective,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clqVars
          ,vector<int,_std::allocator<int>_> *partitionStart)

{
  int64_t *numQueries;
  CliqueVar *pCVar1;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var2;
  pointer piVar3;
  iterator iVar4;
  pointer pCVar5;
  int iVar6;
  HighsInt HVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var11;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var12;
  ulong uVar13;
  HighsInt numClqVars;
  vector<int,_std::allocator<int>_> neighbourhoodInds;
  int local_60;
  int local_5c;
  anon_class_8_1_bccf3fd9 local_58;
  HighsCliqueTable *local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  pCVar1 = (clqVars->
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58.objective = objective;
  local_50 = this;
  HighsRandom::shuffle<HighsCliqueTable::CliqueVar>
            (&this->randgen,pCVar1,
             (HighsInt)
             ((ulong)((long)(clqVars->
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) >> 2));
  _Var11._M_current =
       (clqVars->
       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
       )._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       (clqVars->
       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  _Var12._M_current = _Var11._M_current;
  if (_Var11._M_current != _Var2._M_current) {
    uVar8 = (long)_Var2._M_current - (long)_Var11._M_current >> 2;
    iVar9 = 0;
    if (1 < uVar8) {
      iVar9 = 0;
      do {
        uVar8 = (long)uVar8 >> 1;
        iVar9 = iVar9 + 1;
      } while (1 < uVar8);
    }
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0,true>
              (_Var11,_Var2,local_58,iVar9,true);
    _Var11._M_current =
         (clqVars->
         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    _Var12._M_current =
         (clqVars->
         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
         )._M_impl.super__Vector_impl_data._M_start;
  }
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (&local_48,(long)_Var11._M_current - (long)_Var12._M_current >> 2);
  uVar8 = (long)(clqVars->
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(clqVars->
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                )._M_impl.super__Vector_impl_data._M_start >> 2;
  iVar9 = (int)uVar8;
  piVar3 = (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  local_5c = iVar9;
  std::vector<int,_std::allocator<int>_>::reserve(partitionStart,uVar8);
  local_60 = 0;
  iVar4._M_current =
       (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(partitionStart,iVar4,&local_60);
  }
  else {
    *iVar4._M_current = 0;
    (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current + 1;
  }
  local_60 = 0;
  if (0 < iVar9) {
    numQueries = &local_50->numNeighbourhoodQueries;
    uVar8 = uVar8 & 0xffffffff;
    uVar13 = 0;
    do {
      iVar6 = (int)uVar8;
      if (local_60 == iVar6) {
        iVar4._M_current =
             (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)partitionStart,iVar4,&local_60);
        }
        else {
          *iVar4._M_current = iVar6;
          (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        iVar6 = iVar9;
        if (local_60 <= (int)uVar13) {
          pCVar5 = (clqVars->
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          _Var2._M_current = pCVar5 + local_60;
          _Var11._M_current = pCVar5 + uVar13 + 1;
          uVar13 = 0;
          if (_Var2._M_current == _Var11._M_current) goto LAB_0025f2d1;
          uVar8 = (long)_Var11._M_current - (long)_Var2._M_current >> 2;
          iVar10 = 0;
          if (1 < uVar8) {
            iVar10 = 0;
            do {
              uVar8 = (long)uVar8 >> 1;
              iVar10 = iVar10 + 1;
            } while (1 < uVar8);
          }
          pdqsort_detail::
          pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__1,true>
                    (_Var2,_Var11,local_58,iVar10,true);
        }
        uVar13 = 0;
      }
LAB_0025f2d1:
      pCVar1 = (clqVars->
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               )._M_impl.super__Vector_impl_data._M_start + local_60;
      iVar10 = local_60 + 1;
      HVar7 = partitionNeighbourhood
                        (local_50,&local_48,numQueries,*pCVar1,pCVar1 + 1,iVar6 - iVar10);
      if ((local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start !=
           local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish) &&
         ((int)uVar13 <
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish[-1] + iVar10)) {
        uVar13 = (ulong)(uint)(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish[-1] + iVar10);
      }
      uVar8 = (ulong)(uint)(HVar7 + iVar10);
      local_60 = local_60 + 1;
    } while (local_60 < iVar9);
  }
  iVar4._M_current =
       (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)partitionStart,iVar4,&local_5c);
  }
  else {
    *iVar4._M_current = iVar9;
    (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current + 1;
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsCliqueTable::cliquePartition(const std::vector<double>& objective,
                                       std::vector<CliqueVar>& clqVars,
                                       std::vector<HighsInt>& partitionStart) {
  randgen.shuffle(clqVars.data(), clqVars.size());

  pdqsort_branchless(clqVars.begin(), clqVars.end(),
                     [&](CliqueVar v1, CliqueVar v2) {
                       return (2 * v1.val - 1) * objective[v1.col] >
                              (2 * v2.val - 1) * objective[v2.col];
                     });

  std::vector<HighsInt> neighbourhoodInds;
  neighbourhoodInds.reserve(clqVars.size());

  HighsInt numClqVars = clqVars.size();
  partitionStart.clear();
  partitionStart.reserve(clqVars.size());
  HighsInt extensionEnd = numClqVars;
  partitionStart.push_back(0);
  HighsInt lastSwappedIndex = 0;
  for (HighsInt i = 0; i < numClqVars; ++i) {
    if (i == extensionEnd) {
      partitionStart.push_back(i);
      extensionEnd = numClqVars;
      if (lastSwappedIndex >= i)
        pdqsort_branchless(clqVars.begin() + i,
                           clqVars.begin() + lastSwappedIndex + 1,
                           [&](CliqueVar v1, CliqueVar v2) {
                             return (2 * v1.val - 1) * objective[v1.col] >
                                    (2 * v2.val - 1) * objective[v2.col];
                           });
      lastSwappedIndex = 0;
    }
    CliqueVar v = clqVars[i];
    HighsInt extensionStart = i + 1;
    extensionEnd =
        partitionNeighbourhood(neighbourhoodInds, numNeighbourhoodQueries, v,
                               clqVars.data() + extensionStart,
                               extensionEnd - extensionStart) +
        extensionStart;
    if (!neighbourhoodInds.empty())
      lastSwappedIndex =
          std::max(neighbourhoodInds.back() + extensionStart, lastSwappedIndex);
  }

  partitionStart.push_back(numClqVars);
}